

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void rifft8pt(float *ioptr,float scale)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float Two;
  float t1i;
  float t1r;
  float t0i;
  float t0r;
  float f7i;
  float f7r;
  float f6i;
  float f6r;
  float f5i;
  float f5r;
  float f4i;
  float f4r;
  float f3i;
  float f3r;
  float f2i;
  float f2r;
  float f1i;
  float f1r;
  float f0i;
  float f0r;
  float w1i;
  float w1r;
  float w0r;
  float scale_local;
  float *ioptr_local;
  
  fVar1 = *ioptr + ioptr[1];
  fVar4 = *ioptr - ioptr[1];
  fVar2 = ioptr[4] + ioptr[0xc];
  fVar5 = ioptr[5] - ioptr[0xd];
  fVar6 = ioptr[4] - ioptr[0xc];
  fVar3 = ioptr[5] + ioptr[0xd];
  fVar7 = (fVar2 - fVar6 * 0.70710677) - fVar3 * 0.70710677;
  fVar6 = (fVar5 + fVar6 * 0.70710677) - fVar3 * 0.70710677;
  fVar8 = fVar2 * 2.0 - fVar7;
  fVar5 = fVar6 - fVar5 * 2.0;
  fVar2 = ioptr[2] + ioptr[0xe];
  fVar9 = ioptr[3] - ioptr[0xf];
  fVar10 = ioptr[2] - ioptr[0xe];
  fVar3 = ioptr[3] + ioptr[0xf];
  fVar11 = (fVar2 - fVar10 * 0.38268343) - fVar3 * 0.9238795;
  fVar12 = (fVar9 + fVar10 * 0.9238795) - fVar3 * 0.38268343;
  fVar13 = fVar2 * 2.0 - fVar11;
  fVar14 = fVar12 - fVar9 * 2.0;
  fVar2 = ioptr[6] + ioptr[10];
  fVar15 = ioptr[7] - ioptr[0xb];
  fVar10 = ioptr[6] - ioptr[10];
  fVar3 = ioptr[7] + ioptr[0xb];
  fVar9 = (fVar2 - fVar10 * 0.9238795) - fVar3 * 0.38268343;
  fVar10 = (fVar15 + fVar10 * 0.38268343) - fVar3 * 0.9238795;
  fVar16 = fVar2 * 2.0 - fVar9;
  fVar15 = fVar10 - fVar15 * 2.0;
  fVar2 = fVar1 + ioptr[8] * 2.0;
  fVar17 = fVar4 - ioptr[9] * 2.0;
  fVar1 = fVar1 - ioptr[8] * 2.0;
  fVar4 = fVar4 + ioptr[9] * 2.0;
  fVar18 = fVar7 - fVar8;
  fVar19 = fVar6 - fVar5;
  fVar7 = fVar7 + fVar8;
  fVar6 = fVar6 + fVar5;
  fVar3 = fVar2 + fVar7;
  fVar5 = fVar17 + fVar6;
  fVar2 = fVar2 - fVar7;
  fVar17 = fVar17 - fVar6;
  fVar7 = fVar1 + fVar19;
  fVar20 = fVar4 - fVar18;
  fVar1 = fVar1 - fVar19;
  fVar4 = fVar4 + fVar18;
  fVar6 = fVar11 + fVar16;
  fVar8 = fVar12 + fVar15;
  fVar11 = fVar11 - fVar16;
  fVar12 = fVar12 - fVar15;
  fVar15 = fVar9 - fVar13;
  fVar16 = fVar10 - fVar14;
  fVar9 = fVar9 + fVar13;
  fVar10 = fVar10 + fVar14;
  fVar13 = fVar6 + fVar9;
  fVar14 = fVar8 + fVar10;
  fVar6 = fVar6 - fVar9;
  fVar8 = fVar8 - fVar10;
  fVar9 = fVar11 + fVar16;
  fVar18 = fVar12 - fVar15;
  fVar11 = fVar11 - fVar16;
  fVar12 = fVar12 + fVar15;
  fVar10 = (fVar1 - fVar11 * 0.70710677) + fVar12 * 0.70710677;
  fVar15 = (fVar4 - fVar11 * 0.70710677) - fVar12 * 0.70710677;
  fVar12 = fVar7 + fVar9 * 0.70710677 + fVar18 * 0.70710677;
  fVar9 = (fVar20 - fVar9 * 0.70710677) + fVar18 * 0.70710677;
  *ioptr = scale * (fVar3 + fVar13);
  ioptr[1] = scale * (fVar5 + fVar14);
  ioptr[2] = scale * (fVar1 * 2.0 - fVar10);
  ioptr[3] = scale * (fVar4 * 2.0 - fVar15);
  ioptr[4] = scale * (fVar2 - fVar8);
  ioptr[5] = scale * (fVar17 + fVar6);
  ioptr[6] = scale * (fVar7 * 2.0 - fVar12);
  ioptr[7] = scale * (fVar20 * 2.0 - fVar9);
  ioptr[8] = scale * (fVar3 - fVar13);
  ioptr[9] = scale * (fVar5 - fVar14);
  ioptr[10] = scale * fVar10;
  ioptr[0xb] = scale * fVar15;
  ioptr[0xc] = scale * (fVar2 + fVar8);
  ioptr[0xd] = scale * (fVar17 - fVar6);
  ioptr[0xe] = scale * fVar12;
  ioptr[0xf] = scale * fVar9;
  return;
}

Assistant:

static inline void rifft8pt(float *ioptr, float scale){
/***   RADIX 16 rifft	***/
float w0r = 1.0/MYROOT2; /* cos(pi/4)	*/
float w1r = MYCOSPID8; /* cos(pi/8)	*/
float w1i = MYSINPID8; /* sin(pi/8)	*/
float f0r, f0i, f1r, f1i, f2r, f2i, f3r, f3i;
float f4r, f4i, f5r, f5i, f6r, f6i, f7r, f7i;
float t0r, t0i, t1r, t1i;
const float Two = 2.0;

	/* bit reversed load */
t0r = ioptr[0];
t0i = ioptr[1];
f4r = ioptr[2];
f4i = ioptr[3];
f2r = ioptr[4];
f2i = ioptr[5];
f6r = ioptr[6];
f6i = ioptr[7];
f1r = Two * ioptr[8];
f1i = Two * ioptr[9];
f5r = ioptr[10];
f5i = ioptr[11];
f3r = ioptr[12];
f3i = ioptr[13];
f7r = ioptr[14];
f7i = ioptr[15];


	/* start rfft */
f0r = 	t0r + t0i;    /* compute Re(x[0]) */
f0i = 	t0r - t0i;    /* compute Re(x[N/2]) */

t0r = f2r + f3r;
t0i = f2i - f3i;
t1r = f2r - f3r;
t1i = f2i + f3i;

f2r = t0r - w0r * t1r - w0r * t1i;
f2i = t0i + w0r * t1r - w0r * t1i;
f3r = Two * t0r - f2r;
f3i = f2i - Two * t0i;

t0r = f4r + f7r;
t0i = f4i - f7i;
t1r = f4r - f7r;
t1i = f4i + f7i;

f4r = t0r - w1i * t1r - w1r * t1i;
f4i = t0i + w1r * t1r - w1i * t1i;
f7r = Two * t0r - f4r;
f7i = f4i - Two * t0i;

t0r = f6r + f5r;
t0i = f6i - f5i;
t1r = f6r - f5r;
t1i = f6i + f5i;

f6r = t0r - w1r * t1r - w1i * t1i;
f6i = t0i + w1i * t1r - w1r * t1i;
f5r = Two * t0r - f6r;
f5i = f6i - Two * t0i;

			/* Butterflys		*/
			/*
			f0	-	-	t0	-	-	f0	-	-	f0
			f1*	-  1 -	f1	-	-	f1	-	-	f1
			f2	-	-	f2	-  1 -	f2	-	-	f2
			f3	-  1 -	t1	-  i -	f3	-	-	f3
			f4	-	-	t0	-	-	f4	-  1 -	t0
			f5	-  1 -	f5	-	-	f5	- w3 -	f4
			f6	-	-	f6	-  1 -	f6	-  i -	t1
			f7	-  1 -	t1	-  i -	f7	- iw3-	f6
			*/

t0r = f0r + f1r;
t0i = f0i - f1i;
f1r = f0r - f1r;
f1i = f0i + f1i;

t1r = f2r - f3r;
t1i = f2i - f3i;
f2r = f2r + f3r;
f2i = f2i + f3i;

f0r = t0r + f2r;
f0i = t0i + f2i;
f2r = t0r - f2r;
f2i = t0i - f2i;

f3r = f1r + t1i;
f3i = f1i - t1r;
f1r = f1r - t1i;
f1i = f1i + t1r;


t0r = f4r + f5r;
t0i = f4i + f5i;
f5r = f4r - f5r;
f5i = f4i - f5i;

t1r = f6r - f7r;
t1i = f6i - f7i;
f6r = f6r + f7r;
f6i = f6i + f7i;

f4r = t0r + f6r;
f4i = t0i + f6i;
f6r = t0r - f6r;
f6i = t0i - f6i;

f7r = f5r + t1i;
f7i = f5i - t1r;
f5r = f5r - t1i;
f5i = f5i + t1r;


t0r = f0r - f4r;
t0i = f0i - f4i;
f0r = f0r + f4r;
f0i = f0i + f4i;

t1r = f2r + f6i;
t1i = f2i - f6r;
f2r = f2r - f6i;
f2i = f2i + f6r;

f4r = f1r - f5r * w0r + f5i * w0r;
f4i = f1i - f5r * w0r - f5i * w0r;
f1r = f1r * Two - f4r;
f1i = f1i * Two - f4i;

f6r = f3r + f7r * w0r + f7i * w0r;
f6i = f3i - f7r * w0r + f7i * w0r;
f3r = f3r * Two - f6r;
f3i = f3i * Two - f6i;

	/* store result */
ioptr[0] = scale*f0r;
ioptr[1] = scale*f0i;
ioptr[2] = scale*f1r;
ioptr[3] = scale*f1i;
ioptr[4] = scale*f2r;
ioptr[5] = scale*f2i;
ioptr[6] = scale*f3r;
ioptr[7] = scale*f3i;
ioptr[8] = scale*t0r;
ioptr[9] = scale*t0i;
ioptr[10] = scale*f4r;
ioptr[11] = scale*f4i;
ioptr[12] = scale*t1r;
ioptr[13] = scale*t1i;
ioptr[14] = scale*f6r;
ioptr[15] = scale*f6i;
}